

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmDsd.c
# Opt level: O1

Vec_Wrd_t * Mpm_ManGetTruthWithCnf(int Limit)

{
  Vec_Wrd_t *p;
  word *pwVar1;
  long lVar2;
  
  lVar2 = 0x10;
  p = (Vec_Wrd_t *)malloc(0x10);
  p->nCap = 1000;
  p->nSize = 0;
  pwVar1 = (word *)malloc(8000);
  p->pArray = pwVar1;
  do {
    if (*(int *)(lVar2 + 0xbe8278) <= Limit) {
      Vec_WrdPush(p,*(word *)((long)&s_DsdClass6[0].nVars + lVar2));
    }
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x4a70);
  return p;
}

Assistant:

Vec_Wrd_t * Mpm_ManGetTruthWithCnf( int Limit )
{
    Vec_Wrd_t * vRes = Vec_WrdAlloc( 1000 );
    int i;
    for ( i = 0; i < 595; i++ )
        if ( s_DsdClass6[i].nClauses <= Limit )
            Vec_WrdPush( vRes, s_DsdClass6[i].uTruth );
    return vRes;
}